

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O2

void Bac_PtrDumpBoxBlif(FILE *pFile,Vec_Ptr_t *vBox)

{
  void *pvVar1;
  void *pvVar2;
  int i;
  
  fwrite(".subckt",7,1,(FILE *)pFile);
  pvVar1 = Vec_PtrEntry(vBox,0);
  fprintf((FILE *)pFile," %s",pvVar1);
  for (i = 2; i < vBox->nSize; i = i + 2) {
    pvVar1 = Vec_PtrEntry(vBox,i);
    pvVar2 = Vec_PtrEntry(vBox,i + 1);
    fprintf((FILE *)pFile," %s=%s",pvVar1,pvVar2);
  }
  fputc(10,(FILE *)pFile);
  return;
}

Assistant:

void Bac_PtrDumpBoxBlif( FILE * pFile, Vec_Ptr_t * vBox )
{
    char * pName; int i;
    fprintf( pFile, ".subckt" );
    fprintf( pFile, " %s", (char *)Vec_PtrEntry(vBox, 0) );
    //fprintf( pFile, " %s", (char *)Vec_PtrEntry(vBox, 1) ); // do not write intance name in BLIF
    Vec_PtrForEachEntryStart( char *, vBox, pName, i, 2 )
        fprintf( pFile, " %s=%s", pName, (char *)Vec_PtrEntry(vBox, i+1) ), i++;
    fprintf( pFile, "\n" );
}